

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextInitialize(ImGuiContext *ctx)

{
  ImU32 IVar1;
  ImGuiSettingsHandler local_58;
  
  local_58.WriteAllFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
  local_58.UserData = (void *)0x0;
  local_58.ReadLineFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
  local_58.ApplyAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_58.ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_58.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
  local_58.TypeHash = 0;
  local_58._12_4_ = 0;
  local_58.ClearAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_58.TypeName = "Docking";
  IVar1 = ImHashStr("Docking",0,0);
  local_58.TypeHash = IVar1;
  local_58.ClearAllFn = DockSettingsHandler_ClearAll;
  local_58.ReadInitFn = DockSettingsHandler_ClearAll;
  local_58.ReadOpenFn = DockSettingsHandler_ReadOpen;
  local_58.ReadLineFn = DockSettingsHandler_ReadLine;
  local_58.ApplyAllFn = DockSettingsHandler_ApplyAll;
  local_58.WriteAllFn = DockSettingsHandler_WriteAll;
  ImVector<ImGuiSettingsHandler>::push_back(&ctx->SettingsHandlers,&local_58);
  return;
}

Assistant:

void ImGui::DockContextInitialize(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;

    // Add .ini handle for persistent docking data
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Docking";
    ini_handler.TypeHash = ImHashStr("Docking");
    ini_handler.ClearAllFn = DockSettingsHandler_ClearAll;
    ini_handler.ReadInitFn = DockSettingsHandler_ClearAll; // Also clear on read
    ini_handler.ReadOpenFn = DockSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = DockSettingsHandler_ReadLine;
    ini_handler.ApplyAllFn = DockSettingsHandler_ApplyAll;
    ini_handler.WriteAllFn = DockSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}